

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators)

{
  pointer ppcVar1;
  cmLocalUnixMakefileGenerator3 *this_00;
  TargetType TVar2;
  ostream *poVar3;
  uint uVar4;
  pointer ppcVar5;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  string tname;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_68;
  string local_50;
  
  std::operator<<((ostream *)cmakefileStream,"# Dependency information for all targets:\n");
  std::operator<<((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n");
  uVar4 = 0;
  do {
    ppcVar1 = (lGenerators->
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(lGenerators->
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
        (ulong)uVar4) {
      std::operator<<((ostream *)cmakefileStream,"  )\n");
      return;
    }
    this_00 = (cmLocalUnixMakefileGenerator3 *)ppcVar1[uVar4];
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_68,
               &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets);
    for (ppcVar5 = local_68._M_impl.super__Vector_impl_data._M_start;
        ppcVar5 != local_68._M_impl.super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
      TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
      if (TVar2 == EXECUTABLE) {
LAB_0040b443:
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  (&local_50,this_00,*ppcVar5);
        std::__cxx11::string::append((char *)&local_50);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_50);
        poVar3 = std::operator<<((ostream *)cmakefileStream,"  \"");
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        std::operator<<(poVar3,"\"\n");
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == STATIC_LIBRARY) goto LAB_0040b443;
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == SHARED_LIBRARY) goto LAB_0040b443;
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == MODULE_LIBRARY) goto LAB_0040b443;
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == OBJECT_LIBRARY) goto LAB_0040b443;
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == UTILITY) goto LAB_0040b443;
      }
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_68);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules(
  cmGeneratedFileStream& cmakefileStream,
  std::vector<cmLocalGenerator*>& lGenerators)
{
  cmLocalUnixMakefileGenerator3* lg;

  // now list all the target info files
  cmakefileStream << "# Dependency information for all targets:\n";
  cmakefileStream << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (unsigned int i = 0; i < lGenerators.size(); ++i) {
    lg = static_cast<cmLocalUnixMakefileGenerator3*>(lGenerators[i]);
    // for all of out targets
    std::vector<cmGeneratorTarget*> tgts = lg->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator l = tgts.begin();
         l != tgts.end(); l++) {
      if (((*l)->GetType() == cmStateEnums::EXECUTABLE) ||
          ((*l)->GetType() == cmStateEnums::STATIC_LIBRARY) ||
          ((*l)->GetType() == cmStateEnums::SHARED_LIBRARY) ||
          ((*l)->GetType() == cmStateEnums::MODULE_LIBRARY) ||
          ((*l)->GetType() == cmStateEnums::OBJECT_LIBRARY) ||
          ((*l)->GetType() == cmStateEnums::UTILITY)) {
        cmGeneratorTarget* gt = *l;
        std::string tname = lg->GetRelativeTargetDirectory(gt);
        tname += "/DependInfo.cmake";
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
      }
    }
  }
  cmakefileStream << "  )\n";
}